

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_extrude_twod(REF_GRID *extruded_grid,REF_GRID twod_grid,REF_INT n_planes)

{
  REF_INT RVar1;
  uint uVar2;
  int iVar3;
  REF_STATUS RVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  REF_INT local_1b4;
  long local_1b0;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT node1;
  REF_INT node0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL y;
  REF_GLOB global_offset;
  REF_INT local_148;
  REF_INT faceid2;
  REF_INT faceid1;
  REF_INT max_faceid;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT new_nodes [27];
  int local_c4;
  REF_INT nodes [27];
  REF_INT offset1;
  REF_INT offset0;
  REF_INT offset;
  REF_INT new_node;
  REF_INT node;
  REF_INT plane;
  REF_NODE twod_node;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_GRID pRStack_20;
  REF_INT n_planes_local;
  REF_GRID twod_grid_local;
  REF_GRID *extruded_grid_local;
  
  _node = twod_grid->node;
  *extruded_grid = (REF_GRID)0x0;
  ref_grid._4_4_ = n_planes;
  pRStack_20 = twod_grid;
  twod_grid_local = (REF_GRID)extruded_grid;
  if (twod_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3f9,
           "ref_grid_extrude_twod","require twod grid input");
    extruded_grid_local._4_4_ = 1;
  }
  else {
    uVar2 = ref_grid_create(extruded_grid,twod_grid->mpi);
    if (uVar2 == 0) {
      ref_node = (REF_NODE)twod_grid_local->mpi;
      twod_node = *(REF_NODE *)&ref_node->blank;
      y = 0.0;
      for (new_node = 0; new_node < ref_grid._4_4_; new_node = new_node + 1) {
        dVar8 = (double)new_node;
        iVar3 = ref_grid._4_4_ + -1;
        for (offset = 0; offset < _node->max; offset = offset + 1) {
          if (((-1 < offset) && (offset < _node->max)) && (-1 < _node->global[offset])) {
            if (((offset < 0) || (_node->max <= offset)) || (_node->global[offset] < 0)) {
              local_1b0 = -1;
            }
            else {
              local_1b0 = _node->global[offset];
            }
            uVar2 = ref_node_add(twod_node,local_1b0 + (long)y,&offset0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x405,"ref_grid_extrude_twod",(ulong)uVar2,"add node in plane");
              return uVar2;
            }
            twod_node->part[offset0] = _node->part[offset];
            twod_node->real[offset0 * 0xf] = _node->real[offset * 0xf];
            twod_node->real[offset0 * 0xf + 1] = dVar8 / (double)iVar3;
            twod_node->real[offset0 * 0xf + 2] = _node->real[offset * 0xf + 1];
          }
        }
        y = (REF_DBL)(_node->old_n_global + (long)y);
      }
      uVar2 = ref_node_initialize_n_global(twod_node,(REF_GLOB)y);
      if (uVar2 == 0) {
        for (max_faceid = 0; max_faceid < pRStack_20->cell[0]->max; max_faceid = max_faceid + 1) {
          RVar4 = ref_cell_nodes(pRStack_20->cell[0],max_faceid,new_nodes + 0x1a);
          if (RVar4 == 0) {
            uVar2 = ref_grid_orient_edg(pRStack_20,new_nodes + 0x1a);
            RVar1 = new_nodes[0x1a];
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x412,"ref_grid_extrude_twod",(ulong)uVar2,"orient_edge");
              return uVar2;
            }
            for (new_node = 0; new_node < ref_grid._4_4_ + -1; new_node = new_node + 1) {
              iVar3 = new_node * _node->n;
              iVar5 = (new_node + 1) * _node->n;
              new_cell = local_c4 + iVar3;
              cell = RVar1 + iVar3;
              new_nodes[0] = RVar1 + iVar5;
              new_nodes[1] = local_c4 + iVar5;
              new_nodes[2] = nodes[0];
              uVar2 = ref_cell_add(*(REF_CELL *)&ref_node->naux,&new_cell,&faceid1);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x41e,"ref_grid_extrude_twod",(ulong)uVar2,"boundary");
                return uVar2;
              }
            }
          }
        }
        faceid2 = -0x80000000;
        for (max_faceid = 0; max_faceid < pRStack_20->cell[0]->max; max_faceid = max_faceid + 1) {
          RVar4 = ref_cell_nodes(pRStack_20->cell[0],max_faceid,new_nodes + 0x1a);
          if (RVar4 == 0) {
            if (nodes[0] < faceid2) {
              local_1b4 = faceid2;
            }
            else {
              local_1b4 = nodes[0];
            }
            faceid2 = local_1b4;
          }
        }
        local_148 = faceid2;
        uVar2 = ref_mpi_max(pRStack_20->mpi,&local_148,&faceid2,1);
        if (uVar2 == 0) {
          uVar2 = ref_mpi_bcast(pRStack_20->mpi,&faceid2,1,1);
          if (uVar2 == 0) {
            local_148 = faceid2 + 1;
            iVar3 = faceid2 + 2;
            iVar5 = (ref_grid._4_4_ + -1) * _node->n;
            for (max_faceid = 0; max_faceid < pRStack_20->cell[3]->max; max_faceid = max_faceid + 1)
            {
              RVar4 = ref_cell_nodes(pRStack_20->cell[3],max_faceid,new_nodes + 0x1a);
              if (RVar4 == 0) {
                new_cell = new_nodes[0x1a];
                new_nodes[1] = local_148;
                uVar2 = ref_cell_add((REF_CELL)ref_node->part,&new_cell,&faceid1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x435,"ref_grid_extrude_twod",(ulong)uVar2,"boundary");
                  return uVar2;
                }
                new_cell = new_nodes[0x1a] + iVar5;
                cell = nodes[0] + iVar5;
                new_nodes[0] = local_c4 + iVar5;
                new_nodes[1] = iVar3;
                uVar2 = ref_cell_add((REF_CELL)ref_node->part,&new_cell,&faceid1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x43a,"ref_grid_extrude_twod",(ulong)uVar2,"boundary");
                  return uVar2;
                }
                for (new_node = 0; new_node < ref_grid._4_4_ + -1; new_node = new_node + 1) {
                  iVar6 = new_node * _node->n;
                  iVar7 = (new_node + 1) * _node->n;
                  new_cell = new_nodes[0x1a] + iVar6;
                  cell = local_c4 + iVar6;
                  new_nodes[0] = nodes[0] + iVar6;
                  new_nodes[1] = new_nodes[0x1a] + iVar7;
                  new_nodes[2] = local_c4 + iVar7;
                  new_nodes[3] = nodes[0] + iVar7;
                  uVar2 = ref_cell_add((REF_CELL)ref_node->unused_global,&new_cell,&faceid1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x445,"ref_grid_extrude_twod",(ulong)uVar2,"interior");
                    return uVar2;
                  }
                }
              }
            }
            iVar5 = (ref_grid._4_4_ + -1) * _node->n;
            for (max_faceid = 0; max_faceid < pRStack_20->cell[6]->max; max_faceid = max_faceid + 1)
            {
              RVar4 = ref_cell_nodes(pRStack_20->cell[6],max_faceid,new_nodes + 0x1a);
              if (RVar4 == 0) {
                new_nodes[1] = new_nodes[0x1a];
                new_nodes[2] = local_148;
                uVar2 = ref_cell_add(*(REF_CELL *)&ref_node->naux,&new_cell,&faceid1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x450,"ref_grid_extrude_twod",(ulong)uVar2,"boundary");
                  return uVar2;
                }
                new_cell = new_nodes[0x1a] + iVar5;
                cell = local_c4 + iVar5;
                new_nodes[0] = nodes[0] + iVar5;
                new_nodes[1] = nodes[1] + iVar5;
                new_nodes[2] = iVar3;
                uVar2 = ref_cell_add(*(REF_CELL *)&ref_node->naux,&new_cell,&faceid1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x456,"ref_grid_extrude_twod",(ulong)uVar2,"boundary");
                  return uVar2;
                }
                for (new_node = 0; new_node < ref_grid._4_4_ + -1; new_node = new_node + 1) {
                  iVar6 = new_node * _node->n;
                  iVar7 = (new_node + 1) * _node->n;
                  new_cell = new_nodes[0x1a] + iVar6;
                  cell = local_c4 + iVar6;
                  new_nodes[0] = nodes[0] + iVar6;
                  new_nodes[1] = nodes[1] + iVar6;
                  new_nodes[2] = new_nodes[0x1a] + iVar7;
                  new_nodes[3] = local_c4 + iVar7;
                  new_nodes[4] = nodes[0] + iVar7;
                  new_nodes[5] = nodes[1] + iVar7;
                  uVar2 = ref_cell_add((REF_CELL)ref_node->old_n_global,&new_cell,&faceid1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x463,"ref_grid_extrude_twod",(ulong)uVar2,"boundary");
                    return uVar2;
                  }
                }
              }
            }
            extruded_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x42b,"ref_grid_extrude_twod",(ulong)uVar2,"share max faceid");
            extruded_grid_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x429,"ref_grid_extrude_twod",(ulong)uVar2,"max faceid");
          extruded_grid_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x40d,"ref_grid_extrude_twod",(ulong)uVar2,"init glob");
        extruded_grid_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x3fa,
             "ref_grid_extrude_twod",(ulong)uVar2,"create grid");
      extruded_grid_local._4_4_ = uVar2;
    }
  }
  return extruded_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_extrude_twod(REF_GRID *extruded_grid,
                                         REF_GRID twod_grid, REF_INT n_planes) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_NODE twod_node = ref_grid_node(twod_grid);
  REF_INT plane, node, new_node;
  REF_INT offset, offset0, offset1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_INT max_faceid, faceid1, faceid2;
  REF_GLOB global_offset;
  REF_DBL y;
  *extruded_grid = NULL;
  RAS(ref_grid_twod(twod_grid), "require twod grid input");
  RSS(ref_grid_create(extruded_grid, ref_grid_mpi(twod_grid)), "create grid");
  ref_grid = *extruded_grid;
  ref_node = ref_grid_node(ref_grid);

  global_offset = 0;
  for (plane = 0; plane < n_planes; plane++) {
    y = (REF_DBL)plane / (REF_DBL)(n_planes - 1);
    each_ref_node_valid_node(twod_node, node) {
      RSS(ref_node_add(ref_node,
                       ref_node_global(twod_node, node) + global_offset,
                       &new_node),
          "add node in plane");
      ref_node_part(ref_node, new_node) = ref_node_part(twod_node, node);
      ref_node_xyz(ref_node, 0, new_node) = ref_node_xyz(twod_node, 0, node);
      ref_node_xyz(ref_node, 1, new_node) = y;
      ref_node_xyz(ref_node, 2, new_node) = ref_node_xyz(twod_node, 1, node);
    }
    global_offset += ref_node_n_global(twod_node);
  }
  RSS(ref_node_initialize_n_global(ref_node, global_offset), "init glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    REF_INT node0, node1;
    /* use triangle to orient edge correctly */
    RSS(ref_grid_orient_edg(twod_grid, nodes), "orient_edge");
    node0 = nodes[0];
    node1 = nodes[1];
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = node1 + offset0;
      new_nodes[1] = node0 + offset0;
      new_nodes[2] = node0 + offset1;
      new_nodes[3] = node1 + offset1;
      new_nodes[4] = nodes[2];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  /* find two unused faceids for the symmetry planes */
  max_faceid = REF_INT_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(twod_grid), cell, nodes) {
    max_faceid = MAX(max_faceid, nodes[2]);
  }
  faceid1 = max_faceid;
  RSS(ref_mpi_max(ref_grid_mpi(twod_grid), &faceid1, &max_faceid, REF_INT_TYPE),
      "max faceid");
  RSS(ref_mpi_bcast(ref_grid_mpi(twod_grid), &max_faceid, 1, REF_INT_TYPE),
      "share max faceid");
  faceid1 = max_faceid + 1;
  faceid2 = max_faceid + 2;

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[0];
    new_nodes[1] = nodes[1];
    new_nodes[2] = nodes[2];
    new_nodes[3] = faceid1;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[2] + offset;
    new_nodes[2] = nodes[1] + offset;
    new_nodes[3] = faceid2;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[0] + offset1;
      new_nodes[4] = nodes[1] + offset1;
      new_nodes[5] = nodes[2] + offset1;
      RSS(ref_cell_add(ref_grid_pri(ref_grid), new_nodes, &new_cell),
          "interior");
    }
  }

  offset = (n_planes - 1) * ref_node_n(twod_node);
  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(twod_grid), cell, nodes) {
    new_nodes[0] = nodes[3];
    new_nodes[1] = nodes[2];
    new_nodes[2] = nodes[1];
    new_nodes[3] = nodes[0];
    new_nodes[4] = faceid1;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    new_nodes[0] = nodes[0] + offset;
    new_nodes[1] = nodes[1] + offset;
    new_nodes[2] = nodes[2] + offset;
    new_nodes[3] = nodes[3] + offset;
    new_nodes[4] = faceid2;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), new_nodes, &new_cell), "boundary");
    for (plane = 0; plane < n_planes - 1; plane++) {
      offset0 = (0 + plane) * ref_node_n(twod_node);
      offset1 = (1 + plane) * ref_node_n(twod_node);
      new_nodes[0] = nodes[0] + offset0;
      new_nodes[1] = nodes[1] + offset0;
      new_nodes[2] = nodes[2] + offset0;
      new_nodes[3] = nodes[3] + offset0;
      new_nodes[4] = nodes[0] + offset1;
      new_nodes[5] = nodes[1] + offset1;
      new_nodes[6] = nodes[2] + offset1;
      new_nodes[7] = nodes[3] + offset1;
      RSS(ref_cell_add(ref_grid_hex(ref_grid), new_nodes, &new_cell),
          "boundary");
    }
  }

  return REF_SUCCESS;
}